

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

STArray * __thiscall jbcoin::STObject::getFieldArray(STObject *this,SField *field)

{
  atomic<int> *paVar1;
  int iVar2;
  STArray *pSVar3;
  Counter *pCVar4;
  
  if (getFieldArray(jbcoin::SField_const&)::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&getFieldArray(jbcoin::SField_const&)::empty);
    if (iVar2 != 0) {
      getFieldArray::empty.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d3040;
      getFieldArray::empty.super_STBase.fName = (SField *)sfGeneric;
      pCVar4 = CountedObject<jbcoin::STArray>::getCounter();
      LOCK();
      paVar1 = &(pCVar4->super_CounterBase).m_count;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      getFieldArray::empty.super_STBase._vptr_STBase = (_func_int **)&PTR__STArray_002d2f58;
      getFieldArray::empty.v_.
      super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      getFieldArray::empty.v_.
      super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      getFieldArray::empty.v_.
      super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(STArray::~STArray,&getFieldArray::empty,&__dso_handle);
      __cxa_guard_release(&getFieldArray(jbcoin::SField_const&)::empty);
    }
  }
  pSVar3 = getFieldByConstRef<jbcoin::STArray,jbcoin::STArray>(this,field,&getFieldArray::empty);
  return pSVar3;
}

Assistant:

const STArray& STObject::getFieldArray (SField const& field) const
{
    static STArray const empty{};
    return getFieldByConstRef <STArray> (field, empty);
}